

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  Node *pNVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  Metrics *this_00;
  FILE *__stream;
  pointer other;
  bool bVar4;
  int iVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  Metric *pMVar7;
  undefined1 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  StringPiece *this_02;
  string depfile_err;
  DepfileParser depfile;
  string content;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  StringPiece opath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  DepfileParser local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  ScopedMetric local_98;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  uint64_t local_48;
  StringPiece local_40;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar5 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar7 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"depfile load",(allocator<char> *)&local_b8);
      pMVar7 = Metrics::NewMetric(this_00,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    LoadDepFile::metrics_h_metric = pMVar7;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_98,LoadDepFile::metrics_h_metric);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  iVar5 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,path,&local_b8,err);
  if (iVar5 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_001136cc:
    if (local_b8._M_string_length != 0) {
      DepfileParser::DepfileParser(&local_110);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      bVar4 = DepfileParser::Parse(&local_110,&local_b8,&local_130);
      other = local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (bVar4) {
        if (local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator+(&local_150,path,": no outputs declared");
          this_01 = &local_150;
          std::__cxx11::string::operator=((string *)err,(string *)this_01);
          goto LAB_00113935;
        }
        CanonicalizePath((local_110.outs_.
                          super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                          super__Vector_impl_data._M_start)->str_,
                         &(local_110.outs_.
                           super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                           super__Vector_impl_data._M_start)->len_,&local_48);
        pNVar1 = *(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_40.str_ = (pNVar1->path_)._M_dataplus._M_p;
        local_40.len_ = (pNVar1->path_)._M_string_length;
        bVar4 = StringPiece::operator!=(&local_40,other);
        __stream = _stderr;
        this_02 = local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (bVar4) {
          if (g_explaining == true) {
            pcVar2 = (path->_M_dataplus)._M_p;
            _Var3._M_p = (pNVar1->path_)._M_dataplus._M_p;
            StringPiece::AsString_abi_cxx11_(&local_150,other);
            uVar8 = 0;
            fprintf(__stream,
                    "ninja explain: expected depfile \'%s\' to mention \'%s\', got \'%s\'\n",pcVar2,
                    _Var3._M_p,local_150._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_150);
            goto LAB_0011393c;
          }
          goto LAB_0011393a;
        }
        for (; this_02 !=
               local_110.outs_.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
               .super__Vector_impl_data._M_finish; this_02 = this_02 + 1) {
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                            ((edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,this_02);
          if (_Var6._M_current ==
              (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::operator+(&local_68,path,": depfile mentions \'");
            StringPiece::AsString_abi_cxx11_(&local_88,this_02);
            std::operator+(&local_d8,&local_68,&local_88);
            std::operator+(&local_150,&local_d8,"\' as an output, but no such output was declared");
            std::__cxx11::string::operator=((string *)err,(string *)&local_150);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_88);
            this_01 = &local_68;
            goto LAB_00113935;
          }
        }
        iVar5 = (**this->_vptr_ImplicitDepLoader)(this,edge,&local_110.ins_,err);
        uVar8 = (undefined1)iVar5;
      }
      else {
        std::operator+(&local_d8,path,": ");
        std::operator+(&local_150,&local_d8,&local_130);
        std::__cxx11::string::operator=((string *)err,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        this_01 = &local_d8;
LAB_00113935:
        std::__cxx11::string::~string((string *)this_01);
LAB_0011393a:
        uVar8 = 0;
      }
LAB_0011393c:
      std::__cxx11::string::~string((string *)&local_130);
      DepfileParser::~DepfileParser(&local_110);
      goto LAB_00113950;
    }
    if (g_explaining == true) {
      uVar8 = 0;
      fprintf(_stderr,"ninja explain: depfile \'%s\' is missing\n",(path->_M_dataplus)._M_p);
      goto LAB_00113950;
    }
  }
  else {
    if (iVar5 != 2) goto LAB_001136cc;
    std::operator+(&local_150,"loading \'",path);
    std::operator+(&local_130,&local_150,"\': ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                   &local_130,err);
    std::__cxx11::string::operator=((string *)err,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  uVar8 = 0;
LAB_00113950:
  std::__cxx11::string::~string((string *)&local_b8);
  ScopedMetric::~ScopedMetric(&local_98);
  return (bool)uVar8;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  CanonicalizePath(const_cast<char*>(primary_out->str_), &primary_out->len_,
                   &unused);

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  return ProcessDepfileDeps(edge, &depfile.ins_, err);
}